

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O2

void __thiscall absl::lts_20250127::cord_internal::CordRepBtree::AlignEnd(CordRepBtree *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = (ulong)(this->super_CordRep).storage[2];
  lVar3 = uVar2 - 6;
  if (lVar3 != 0) {
    uVar1 = (ulong)(this->super_CordRep).storage[1] - lVar3;
    (this->super_CordRep).storage[1] = (uint8_t)uVar1;
    (this->super_CordRep).storage[2] = '\x06';
    for (uVar4 = 5; uVar1 <= uVar4; uVar4 = uVar4 - 1) {
      this->edges_[uVar4] = *(CordRep **)((long)(&this->super_CordRep + -2) + uVar4 * 8 + uVar2 * 8)
      ;
    }
  }
  return;
}

Assistant:

size_t end() const { return static_cast<size_t>(storage[2]); }